

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_const_2.h
# Opt level: O3

int __thiscall
PlayerConst_2::move(PlayerConst_2 *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  int iVar1;
  
  iVar1 = rand();
  if ((iVar1 * -0x33333333 + 0x19999998U >> 2 | iVar1 * 0x40000000) < 0xccccccd) {
    iVar1 = rand();
    iVar1 = iVar1 % 3;
    this->m_play = iVar1;
  }
  else {
    iVar1 = this->m_play;
  }
  return iVar1;
}

Assistant:

int move(const std::vector<Move>& moveHistory)
   {
      // Every ten moves or so, it will change strategy.
      if ((rand()%20) == 0)
      {
         m_play = rand() % 3;
      }
      return m_play;
   }